

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void initialize_impute_calc<ImputedData<long,double>,PredictionData<float,long>>
               (ImputedData<long,_double> *imp,PredictionData<float,_long> *prediction_data,
               Imputer *imputer,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t *psVar2;
  float *pfVar3;
  pointer puVar4;
  size_t sVar5;
  long *plVar6;
  long *plVar7;
  pointer plVar8;
  long lVar9;
  int *piVar10;
  pointer pvVar11;
  pointer pdVar12;
  value_type_conflict in_RAX;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  pointer pdVar16;
  vector<double,_std::allocator<double>_> *this;
  long lVar17;
  size_t __n;
  size_t col;
  size_t sVar18;
  value_type_conflict local_38;
  
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  imp->n_missing_sp = 0;
  local_38 = in_RAX;
  if (prediction_data->numeric_data == (float *)0x0) {
    if (prediction_data->Xr == (float *)0x0) goto LAB_002dc2dd;
    if ((imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<long,_std::allocator<long>_>::resize(&imp->missing_sp,imputer->ncols_numeric);
    }
    plVar6 = prediction_data->Xr_indptr;
    lVar17 = plVar6[row];
    if (lVar17 < plVar6[row + 1]) {
      pfVar3 = prediction_data->Xr;
      plVar7 = prediction_data->Xr_ind;
      plVar8 = (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar3[lVar17])) {
          lVar9 = plVar7[lVar17];
          sVar5 = imp->n_missing_sp;
          imp->n_missing_sp = sVar5 + 1;
          plVar8[sVar5] = lVar9;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < plVar6[row + 1]);
    }
    pdVar16 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar16) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->sp_num_sum,imputer->ncols_numeric,&local_38);
      this = &imp->sp_num_weight;
      goto LAB_002dc2ce;
    }
    if (imp->n_missing_sp == 0) goto LAB_002dc2dd;
    __n = imp->n_missing_sp << 3;
    memset(pdVar16,0,__n);
    pdVar16 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    pvVar1 = &imp->missing_num;
    if ((imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_numeric);
    }
    psVar2 = &imp->n_missing_num;
    uVar13 = imputer->ncols_numeric;
    if (prediction_data->is_col_major == false) {
      if (uVar13 != 0) {
        pfVar3 = prediction_data->numeric_data;
        puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar15 = 0;
        do {
          if (0x7f7fffff < (*(uint *)((long)pfVar3 + uVar15 * 4 + uVar13 * row * 4) & 0x7fffffff)) {
            sVar5 = *psVar2;
            *psVar2 = sVar5 + 1;
            puVar4[sVar5] = uVar15;
          }
          uVar15 = uVar15 + 1;
          uVar13 = imputer->ncols_numeric;
        } while (uVar15 < uVar13);
      }
    }
    else if (uVar13 != 0) {
      pfVar3 = prediction_data->numeric_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar3[row + prediction_data->nrows * uVar13])) {
          sVar5 = *psVar2;
          *psVar2 = sVar5 + 1;
          puVar4[sVar5] = uVar13;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < imputer->ncols_numeric);
    }
    pdVar16 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar16) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->num_sum,imputer->ncols_numeric,&local_38);
      this = &imp->num_weight;
LAB_002dc2ce:
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(this,imputer->ncols_numeric,&local_38);
      goto LAB_002dc2dd;
    }
    if (*psVar2 == 0) goto LAB_002dc2dd;
    __n = *psVar2 << 3;
    memset(pdVar16,0,__n);
    pdVar16 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  memset(pdVar16,0,__n);
LAB_002dc2dd:
  if (prediction_data->categ_data != (int *)0x0) {
    pvVar1 = &imp->missing_cat;
    if ((imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_categ);
    }
    uVar13 = imputer->ncols_categ;
    if (prediction_data->is_col_major == false) {
      if (uVar13 != 0) {
        piVar10 = prediction_data->categ_data;
        puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar14 = 0;
        do {
          if (*(int *)((long)piVar10 + uVar14 * 4 + uVar13 * row * 4) < 0) {
            sVar5 = imp->n_missing_cat;
            imp->n_missing_cat = sVar5 + 1;
            puVar4[sVar5] = uVar14;
          }
          uVar14 = uVar14 + 1;
          uVar13 = imputer->ncols_categ;
        } while (uVar14 < uVar13);
      }
    }
    else if (uVar13 != 0) {
      piVar10 = prediction_data->categ_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        if (piVar10[row + prediction_data->nrows * uVar13] < 0) {
          sVar5 = imp->n_missing_cat;
          imp->n_missing_cat = sVar5 + 1;
          puVar4[sVar5] = uVar13;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < imputer->ncols_categ);
    }
    pdVar16 = (imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar16) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->cat_weight,imputer->ncols_categ,&local_38);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&imp->cat_sum,imputer->ncols_categ);
      if (imputer->ncols_categ != 0) {
        lVar17 = 0;
        uVar13 = 0;
        do {
          local_38 = 0.0;
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     ((long)&(((imp->cat_sum).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar17),
                     (long)(imputer->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar13],&local_38);
          uVar13 = uVar13 + 1;
          lVar17 = lVar17 + 0x18;
        } while (uVar13 < imputer->ncols_categ);
      }
    }
    else {
      sVar5 = imp->n_missing_cat;
      if (sVar5 != 0) {
        sVar18 = 0;
        memset(pdVar16,0,sVar5 * 8);
        pvVar11 = (imp->cat_sum).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (imp->missing_cat).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          uVar15 = puVar4[sVar18];
          pdVar16 = pvVar11[uVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar12 = *(pointer *)
                     ((long)&pvVar11[uVar15].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8);
          if (pdVar16 != pdVar12) {
            memset(pdVar16,0,((long)pdVar12 + (-8 - (long)pdVar16) & 0xfffffffffffffff8U) + 8);
          }
          sVar18 = sVar18 + 1;
        } while (sVar5 != sVar18);
      }
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, PredictionData &prediction_data, Imputer &imputer, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (prediction_data.numeric_data != NULL)
    {
        if (!imp.missing_num.size())
            imp.missing_num.resize(imputer.ncols_numeric);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        if (!imp.num_sum.size())
        {
            imp.num_sum.resize(imputer.ncols_numeric,    0);
            imp.num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.num_sum.begin(),     imp.num_sum.begin()    + imp.n_missing_num,  0);
            std::fill(imp.num_weight.begin(),  imp.num_weight.begin() + imp.n_missing_num,  0);
        }
    }

    else if (prediction_data.Xr != NULL)
    {
        if (!imp.missing_sp.size())
            imp.missing_sp.resize(imputer.ncols_numeric);
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            if (is_na_or_inf(prediction_data.Xr[ix]))
                imp.missing_sp[imp.n_missing_sp++] = prediction_data.Xr_ind[ix];

        if (!imp.sp_num_sum.size())
        {
            imp.sp_num_sum.resize(imputer.ncols_numeric,    0);
            imp.sp_num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.sp_num_sum.begin(),     imp.sp_num_sum.begin()    + imp.n_missing_sp,  0);
            std::fill(imp.sp_num_weight.begin(),  imp.sp_num_weight.begin() + imp.n_missing_sp,  0);
        }
    }
    
    if (prediction_data.categ_data != NULL)
    {
        if (!imp.missing_cat.size())
            imp.missing_cat.resize(imputer.ncols_categ);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        if (!imp.cat_weight.size())
        {
            imp.cat_weight.resize(imputer.ncols_categ, 0);
            imp.cat_sum.resize(imputer.ncols_categ);
            for (size_t col = 0; col < imputer.ncols_categ; col++)
                imp.cat_sum[col].resize(imputer.ncat[col], 0);
        }

        else
        {
            std::fill(imp.cat_weight.begin(), imp.cat_weight.begin() + imp.n_missing_cat, 0);
            for (size_t col = 0; col < imp.n_missing_cat; col++)
                std::fill(imp.cat_sum[imp.missing_cat[col]].begin(),
                          imp.cat_sum[imp.missing_cat[col]].end(),
                          0);
        }
    }
}